

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTSIZEEnc(octet *der,u32 tag,size_t val)

{
  size_t sVar1;
  size_t sVar2;
  size_t v;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  octet *der_00;
  long lVar6;
  octet *poVar7;
  
  lVar6 = -1;
  poVar7 = der;
  for (sVar3 = val; 0xff < sVar3; sVar3 = sVar3 >> 8) {
    lVar6 = lVar6 + -1;
    poVar7 = poVar7 + 1;
  }
  sVar1 = derTEnc(der,tag);
  sVar2 = 0xffffffffffffffff;
  if (sVar1 != 0xffffffffffffffff) {
    uVar4 = sVar3 >> 7;
    der_00 = der + sVar1;
    if (der == (octet *)0x0) {
      der_00 = (octet *)0x0;
    }
    sVar3 = derLEnc(der_00,uVar4 - lVar6);
    if (sVar3 != 0xffffffffffffffff) {
      if (der != (octet *)0x0) {
        for (lVar5 = 0; lVar6 - uVar4 != lVar5; lVar5 = lVar5 + -1) {
          poVar7[sVar3 + sVar1 + uVar4 + lVar5] = (octet)val;
          val = val >> 8;
        }
      }
      sVar2 = (sVar3 + sVar1 + uVar4) - lVar6;
    }
  }
  return sVar2;
}

Assistant:

size_t derTSIZEEnc(octet der[], u32 tag, size_t val)
{
	size_t len = 1;
	size_t t_count;
	size_t l_count;
	// определить длину V
	{
		register size_t v = val;
		for (; v >= 256; v >>= 8, ++len);
		len += v >> 7, v = 0;
	}
	// кодировать T
	t_count = derTEnc(der, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать L
	l_count = derLEnc(der ? der + t_count : 0, len);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать V
	if (der)
	{
		size_t pos = len;
		der += t_count + l_count;
		ASSERT(memIsValid(der, len));
		for (; pos--; val >>= 8)
			der[pos] = (octet)val;
	}
	return t_count + l_count + len;
}